

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshaderdescription.cpp
# Opt level: O3

BuiltinVariable *
deserializeBuiltinVar(BuiltinVariable *__return_storage_ptr__,QDataStream *stream,int version)

{
  pointer piVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  int count;
  int t;
  int local_38;
  BuiltinType local_34;
  BuiltinVariable *local_30;
  
  local_30 = *(BuiltinVariable **)(in_FS_OFFSET + 0x28);
  *(undefined1 **)__return_storage_ptr__ = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->arrayDims).d.d = (Data *)0x0;
  (__return_storage_ptr__->arrayDims).d.ptr = (int *)0x0;
  (__return_storage_ptr__->arrayDims).d.size = 0;
  local_34 = 0xaaaaaaaa;
  QDataStream::operator>>(stream,(int *)&local_34);
  __return_storage_ptr__->type = local_34;
  if (8 < version) {
    QDataStream::operator>>(stream,(int *)&local_34);
    __return_storage_ptr__->varType = local_34;
    local_38 = -0x55555556;
    QDataStream::operator>>(stream,&local_38);
    QList<int>::resize(&__return_storage_ptr__->arrayDims,(long)local_38);
    if (0 < local_38) {
      lVar3 = 0;
      lVar2 = 0;
      do {
        piVar1 = QList<int>::data(&__return_storage_ptr__->arrayDims);
        QDataStream::operator>>(stream,(int *)((long)piVar1 + lVar3));
        lVar2 = lVar2 + 1;
        lVar3 = lVar3 + 4;
      } while (lVar2 < local_38);
    }
  }
  if (*(BuiltinVariable **)(in_FS_OFFSET + 0x28) == local_30) {
    return *(BuiltinVariable **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static QShaderDescription::BuiltinVariable deserializeBuiltinVar(QDataStream *stream, int version)
{
    QShaderDescription::BuiltinVariable var;
    int t;
    (*stream) >> t;
    var.type = QShaderDescription::BuiltinType(t);
    if (version > QShaderPrivate::QSB_VERSION_WITHOUT_INPUT_OUTPUT_INTERFACE_BLOCKS) {
        (*stream) >> t;
        var.varType = QShaderDescription::VariableType(t);
        int count;
        (*stream) >> count;
        var.arrayDims.resize(count);
        for (int i = 0; i < count; ++i)
            (*stream) >> var.arrayDims[i];
    }
    return var;
}